

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionarydata.cpp
# Opt level: O2

int32_t __thiscall
icu_63::BytesDictionaryMatcher::matches
          (BytesDictionaryMatcher *this,UText *text,int32_t maxLength,int32_t limit,int32_t *lengths
          ,int32_t *cpLengths,int32_t *values,int32_t *prefix)

{
  UChar32 UVar1;
  UStringTrieResult UVar2;
  int32_t iVar3;
  int64_t iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  BytesTrie bt;
  int local_7c;
  BytesTrie local_70;
  int32_t *local_50;
  int32_t *local_48;
  int64_t local_40;
  BytesDictionaryMatcher *local_38;
  
  local_70.bytes_ = (uint8_t *)this->characters;
  local_70.ownedArray_ = (uint8_t *)0x0;
  local_70.remainingMatchLength_ = -1;
  local_70.pos_ = local_70.bytes_;
  local_38 = this;
  local_40 = utext_getNativeIndex_63(text);
  local_50 = lengths;
  local_48 = cpLengths;
  UVar1 = utext_next32_63(text);
  local_7c = 0;
  iVar6 = 0;
  do {
    if (UVar1 < 0) {
LAB_002ebb95:
      if (prefix != (int32_t *)0x0) {
        *prefix = iVar6;
      }
      BytesTrie::~BytesTrie(&local_70);
      return local_7c;
    }
    UVar1 = transform(local_38,UVar1);
    if (iVar6 == 0) {
      UVar2 = BytesTrie::first(&local_70,UVar1);
    }
    else {
      UVar2 = BytesTrie::next(&local_70,UVar1);
    }
    iVar4 = utext_getNativeIndex_63(text);
    iVar7 = (int)iVar4 - (int)local_40;
    if ((int)UVar2 < 2) {
      if (UVar2 != USTRINGTRIE_NO_MATCH) goto LAB_002ebb7b;
LAB_002ebb92:
      iVar6 = iVar6 + 1;
      goto LAB_002ebb95;
    }
    if (local_7c < limit) {
      lVar5 = (long)local_7c;
      if (values != (int32_t *)0x0) {
        iVar3 = BytesTrie::getValue(&local_70);
        values[lVar5] = iVar3;
      }
      if (local_50 != (int32_t *)0x0) {
        local_50[lVar5] = iVar7;
      }
      if (local_48 != (int32_t *)0x0) {
        local_48[lVar5] = iVar6 + 1;
      }
      local_7c = local_7c + 1;
    }
    if (UVar2 == USTRINGTRIE_FINAL_VALUE) goto LAB_002ebb92;
LAB_002ebb7b:
    if (maxLength <= iVar7) goto LAB_002ebb92;
    UVar1 = utext_next32_63(text);
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

int32_t BytesDictionaryMatcher::matches(UText *text, int32_t maxLength, int32_t limit,
                            int32_t *lengths, int32_t *cpLengths, int32_t *values,
                            int32_t *prefix) const {
    BytesTrie bt(characters);
    int32_t startingTextIndex = (int32_t)utext_getNativeIndex(text);
    int32_t wordCount = 0;
    int32_t codePointsMatched = 0;

    for (UChar32 c = utext_next32(text); c >= 0; c=utext_next32(text)) {
        UStringTrieResult result = (codePointsMatched == 0) ? bt.first(transform(c)) : bt.next(transform(c));
        int32_t lengthMatched = (int32_t)utext_getNativeIndex(text) - startingTextIndex;
        codePointsMatched += 1;
        if (USTRINGTRIE_HAS_VALUE(result)) {
            if (wordCount < limit) {
                if (values != NULL) {
                    values[wordCount] = bt.getValue();
                }
                if (lengths != NULL) {
                    lengths[wordCount] = lengthMatched;
                }
                if (cpLengths != NULL) {
                    cpLengths[wordCount] = codePointsMatched;
                }
                ++wordCount;
            }
            if (result == USTRINGTRIE_FINAL_VALUE) {
                break;
            }
        }
        else if (result == USTRINGTRIE_NO_MATCH) {
            break;
        }
        if (lengthMatched >= maxLength) {
            break;
        }
    }

    if (prefix != NULL) {
        *prefix = codePointsMatched;
    }
    return wordCount;
}